

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-cc.cpp
# Opt level: O1

void configureCatmullClarkProgram(void)

{
  float fVar1;
  
  fVar1 = tanf(((g_camera.fovy * 3.1415927) / 180.0) * 0.5);
  (*glad_glProgramUniform1f)
            (g_gl.programs[1],g_gl.uniforms[4],
             ((fVar1 + fVar1) / (float)g_framebuffer.w) *
             (float)(1 << ((byte)g_patch.gpuSubd & 0x1f)) * g_patch.primitivePixelLengthTarget);
  return;
}

Assistant:

void configureCatmullClarkProgram()
{
    float lodFactor = 2.0f * tan(radians(g_camera.fovy) / 2.0f)
                    / g_framebuffer.w * (1 << g_patch.gpuSubd)
                    * g_patch.primitivePixelLengthTarget;

    glProgramUniform1f(g_gl.programs[PROGRAM_CC],
                       g_gl.uniforms[UNIFORM_CC_LOD_FACTOR],
                       lodFactor);
}